

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

bool __thiscall Minisat::Solver::satisfied(Solver *this,Clause *c)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Lit p;
  lbool local_25;
  int local_24;
  Clause *pCStack_20;
  int i;
  Clause *c_local;
  Solver *this_local;
  
  local_24 = 0;
  pCStack_20 = c;
  c_local = (Clause *)this;
  while( true ) {
    iVar1 = local_24;
    iVar3 = Clause::size(pCStack_20);
    if (iVar3 <= iVar1) {
      return false;
    }
    p = Clause::operator[](pCStack_20,local_24);
    local_25 = value(this,p);
    bVar2 = lbool::operator==(&local_25,l_True);
    if (bVar2) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Solver::satisfied(const Clause& c) const {
    for (int i = 0; i < c.size(); i++)
        if (value(c[i]) == l_True)
            return true;
    return false; }